

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall
djb::tab::tab(tab *this,vector<float,_std::allocator<float>_> *ndf,int zres,int pres)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  void *in_R8;
  ideal<1> local_30;
  
  local_30.super_impl._vptr_impl = (impl)&PTR_clone_001fcae0;
  (this->super_microfacet).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f2ce0;
  iVar1 = fresnel::ideal<1>::clone
                    (&local_30,(__fn *)ndf,(void *)CONCAT44(in_register_00000014,zres),pres,in_R8);
  (this->super_microfacet).m_fresnel.m_f = (impl *)CONCAT44(extraout_var,iVar1);
  (this->super_microfacet).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f2e00;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf,ndf);
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_zres = zres;
  this->m_pres = pres;
  configure(this);
  return;
}

Assistant:

tab::tab(const std::vector<float_t> &ndf, int zres, int pres):
	microfacet(fresnel::ideal<1>()), m_ndf(ndf), m_zres(zres), m_pres(pres)
{
	configure();
}